

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int check_default(lys_type *type,char **value,lys_module *module,int tpdf)

{
  uint uVar1;
  ly_ctx *ctx_00;
  lys_node_leaf *plVar2;
  int iVar3;
  char *pcVar4;
  lys_module *plVar5;
  lys_type *plVar6;
  ly_ctx *ctx;
  int r;
  int ret;
  char *s;
  char *dflt;
  lyd_node_leaf_list node;
  lys_tpdf *base_tpdf;
  lys_module *plStack_20;
  int tpdf_local;
  lys_module *module_local;
  char **value_local;
  lys_type *type_local;
  
  node.value_type = LY_TYPE_DER;
  node.value_flags = '\0';
  node._77_3_ = 0;
  s = (char *)0x0;
  ctx._4_4_ = 0;
  ctx_00 = module->ctx;
  if (value == (char **)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0xd96,
                  "int check_default(struct lys_type *, const char **, struct lys_module *, int)");
  }
  memset(&dflt,0,0x50);
  if (type->base == LY_TYPE_DER) {
    ctx._4_4_ = 1;
    goto LAB_00123f96;
  }
  if ((tpdf == 0) && ((*(ushort *)&module->field_0x40 >> 7 & 1) == 0)) goto LAB_00123f96;
  if ((tpdf != 0) &&
     (((*(ushort *)&module->field_0x40 >> 7 & 1) == 0 && (type->base == LY_TYPE_IDENT)))) {
    if (*value != (char *)0x0) {
      pcVar4 = strchr(*value,0x3a);
      if (pcVar4 == (char *)0x0) {
        plVar5 = lys_main_module(module);
        iVar3 = asprintf((char **)&r,"%s:%s",plVar5->name,*value);
        if (iVar3 == -1) {
          ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","check_default");
          ctx._4_4_ = -1;
          goto LAB_00123f96;
        }
        s = lydict_insert_zc(ctx_00,_r);
      }
      else {
        s = transform_schema2json(module,*value);
      }
      lydict_remove(ctx_00,*value);
      *value = s;
      s = (char *)0x0;
    }
    goto LAB_00123f96;
  }
  if ((type->base == LY_TYPE_LEAFREF) && (tpdf != 0)) goto LAB_00123f96;
  s = lydict_insert(ctx_00,*value,0);
  plStack_20 = module;
  if (s != (char *)0x0) {
    if (type->base == LY_TYPE_EMPTY) {
      ly_vlog(ctx_00,LYE_INCHILDSTMT,LY_VLOG_NONE,(void *)0x0,"default",type->parent->name);
      ly_vlog(ctx_00,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
              "The \"empty\" data type cannot have a default value.");
      ctx._4_4_ = -1;
      goto LAB_00123f96;
    }
    goto LAB_00123ca5;
  }
  for (node._72_8_ = type->der; *(long *)(node._72_8_ + 0x48) != 0;
      node._72_8_ = *(undefined8 *)(node._72_8_ + 0x48)) {
    if (*(long *)(node._72_8_ + 0x78) != 0) {
      s = lydict_insert(ctx_00,*(char **)(node._72_8_ + 0x78),0);
      break;
    }
  }
  if (s == (char *)0x0) goto LAB_00123f96;
  switch(type->base) {
  case LY_TYPE_BINARY:
    plVar2 = (lys_node_leaf *)(type->info).bits.bit;
    goto joined_r0x00123bde;
  case LY_TYPE_BITS:
    uVar1 = (type->info).bits.count;
    goto joined_r0x00123ba2;
  case LY_TYPE_BOOL:
  case LY_TYPE_EMPTY:
  case LY_TYPE_INST:
  case LY_TYPE_LEAFREF:
    goto LAB_00123f96;
  case LY_TYPE_DEC64:
    plVar2 = (lys_node_leaf *)(type->info).bits.bit;
    goto joined_r0x00123bde;
  case LY_TYPE_ENUM:
    uVar1 = (type->info).bits.count;
joined_r0x00123ba2:
    if (uVar1 == 0) goto LAB_00123f96;
    break;
  case LY_TYPE_IDENT:
    plVar5 = lys_main_module(*(lys_module **)(*(long *)(node._72_8_ + 0x50) + 0x30));
    if ((*(ushort *)&plVar5->field_0x40 >> 7 & 1) != 0) goto LAB_00123f96;
    plStack_20 = *(lys_module **)(node._72_8_ + 0x30);
    break;
  case LY_TYPE_STRING:
    if ((type->info).bits.bit == (lys_type_bit *)0x0) {
      plVar2 = (type->info).lref.target;
      goto joined_r0x00123bde;
    }
    break;
  case LY_TYPE_UNION:
    break;
  case LY_TYPE_INT8:
  case LY_TYPE_UINT8:
  case LY_TYPE_INT16:
  case LY_TYPE_UINT16:
  case LY_TYPE_INT32:
  case LY_TYPE_UINT32:
  case LY_TYPE_INT64:
  case LY_TYPE_UINT64:
    plVar2 = (lys_node_leaf *)(type->info).bits.bit;
joined_r0x00123bde:
    if (plVar2 == (lys_node_leaf *)0x0) goto LAB_00123f96;
    break;
  default:
    ly_log(ctx_00,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
           ,0xe05);
    ctx._4_4_ = -1;
    goto LAB_00123f96;
  }
LAB_00123ca5:
  memset(&dflt,0,0x50);
  node._48_8_ = lydict_insert(ctx_00,s,0);
  node.value.int32 = type->base;
  if (tpdf == 0) {
    dflt = (char *)type->parent;
  }
  else {
    dflt = (char *)calloc(1,0xd0);
    if ((char **)dflt == (char **)0x0) {
      ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","check_default");
      ctx._4_4_ = -1;
      goto LAB_00123f96;
    }
    iVar3 = asprintf((char **)dflt,"typedef-%s-default",type->parent->name);
    if (iVar3 == -1) {
      ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","check_default");
      ctx._4_4_ = -1;
      goto LAB_00123f96;
    }
    *(lys_module **)(dflt + 0x30) = plStack_20;
    memcpy(dflt + 0x80,type,0x40);
  }
  if (type->base == LY_TYPE_LEAFREF) {
    if ((type->info).lref.target == (lys_node_leaf *)0x0) {
      ctx._4_4_ = 1;
      ly_vlog(ctx_00,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
              "Default value \"%s\" cannot be checked in an unresolved leafref.",s);
    }
    else {
      ctx._4_4_ = check_default(&((type->info).lref.target)->type,&s,plStack_20,0);
      if ((ctx._4_4_ == 0) && (*value != (char *)0x0)) {
        lydict_remove(ctx_00,*value);
        *value = s;
        s = (char *)0x0;
      }
    }
  }
  else {
    plVar6 = lyp_parse_value(type,(char **)&node.hash,(lyxml_elem *)0x0,(lyd_node_leaf_list *)&dflt,
                             (lyd_attr *)0x0,plStack_20,1,1,0);
    if (plVar6 == (lys_type *)0x0) {
      ctx._4_4_ = 1;
      if ((node._72_8_ != 0) &&
         (((type->base == LY_TYPE_BITS && ((type->der->type).der != (lys_tpdf *)0x0)) ||
          ((type->base == LY_TYPE_ENUM && ((type->der->type).der != (lys_tpdf *)0x0)))))) {
        ly_vlog(ctx_00,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                "Invalid value \"%s\" of the default statement inherited to \"%s\" from \"%s\" base type."
                ,s,type->parent->name,*(undefined8 *)node._72_8_);
      }
    }
    else if (s != (char *)node._48_8_) {
      if (s != *value) {
        __assert_fail("ly_strequal(dflt, *value, 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                      ,0xe4b,
                      "int check_default(struct lys_type *, const char **, struct lys_module *, int)"
                     );
      }
      lydict_remove(ctx_00,*value);
      *value = (char *)node._48_8_;
      node.hash = 0;
      node._52_4_ = 0;
    }
  }
LAB_00123f96:
  lyd_free_value((lyd_val)node.value_str,node.value.uint32,node.value.uint64._4_1_,type,
                 (char *)node._48_8_,(lyd_val *)0x0,(LY_DATA_TYPE *)0x0,(uint8_t *)0x0);
  lydict_remove(ctx_00,(char *)node._48_8_);
  if ((tpdf != 0) && (dflt != (char *)0x0)) {
    free(*(void **)dflt);
    free(dflt);
  }
  lydict_remove(ctx_00,s);
  return ctx._4_4_;
}

Assistant:

static int
check_default(struct lys_type *type, const char **value, struct lys_module *module, int tpdf)
{
    struct lys_tpdf *base_tpdf = NULL;
    struct lyd_node_leaf_list node;
    const char *dflt = NULL;
    char *s;
    int ret = EXIT_SUCCESS, r;
    struct ly_ctx *ctx = module->ctx;

    assert(value);
    memset(&node, 0, sizeof node);

    if (type->base <= LY_TYPE_DER) {
        /* the type was not resolved yet, nothing to do for now */
        ret = EXIT_FAILURE;
        goto cleanup;
    } else if (!tpdf && !module->implemented) {
        /* do not check defaults in not implemented module's data */
        goto cleanup;
    } else if (tpdf && !module->implemented && type->base == LY_TYPE_IDENT) {
        /* identityrefs are checked when instantiated in data instead of typedef,
         * but in typedef the value has to be modified to include the prefix */
        if (*value) {
            if (strchr(*value, ':')) {
                dflt = transform_schema2json(module, *value);
            } else {
                /* default prefix of the module where the typedef is defined */
                if (asprintf(&s, "%s:%s", lys_main_module(module)->name, *value) == -1) {
                    LOGMEM(ctx);
                    ret = -1;
                    goto cleanup;
                }
                dflt = lydict_insert_zc(ctx, s);
            }
            lydict_remove(ctx, *value);
            *value = dflt;
            dflt = NULL;
        }
        goto cleanup;
    } else if (type->base == LY_TYPE_LEAFREF && tpdf) {
        /* leafref in typedef cannot be checked */
        goto cleanup;
    }

    dflt = lydict_insert(ctx, *value, 0);
    if (!dflt) {
        /* we do not have a new default value, so is there any to check even, in some base type? */
        for (base_tpdf = type->der; base_tpdf->type.der; base_tpdf = base_tpdf->type.der) {
            if (base_tpdf->dflt) {
                dflt = lydict_insert(ctx, base_tpdf->dflt, 0);
                break;
            }
        }

        if (!dflt) {
            /* no default value, nothing to check, all is well */
            goto cleanup;
        }

        /* so there is a default value in a base type, but can the default value be no longer valid (did we define some new restrictions)? */
        switch (type->base) {
        case LY_TYPE_IDENT:
            if (lys_main_module(base_tpdf->type.parent->module)->implemented) {
                goto cleanup;
            } else {
                /* check the default value from typedef, but use also the typedef's module
                 * due to possible searching in imported modules which is expected in
                 * typedef's module instead of module where the typedef is used */
                module = base_tpdf->module;
            }
            break;
        case LY_TYPE_INST:
        case LY_TYPE_LEAFREF:
        case LY_TYPE_BOOL:
        case LY_TYPE_EMPTY:
            /* these have no restrictions, so we would do the exact same work as the unres in the base typedef */
            goto cleanup;
        case LY_TYPE_BITS:
            /* the default value must match the restricted list of values, if the type was restricted */
            if (type->info.bits.count) {
                break;
            }
            goto cleanup;
        case LY_TYPE_ENUM:
            /* the default value must match the restricted list of values, if the type was restricted */
            if (type->info.enums.count) {
                break;
            }
            goto cleanup;
        case LY_TYPE_DEC64:
            if (type->info.dec64.range) {
                break;
            }
            goto cleanup;
        case LY_TYPE_BINARY:
            if (type->info.binary.length) {
                break;
            }
            goto cleanup;
        case LY_TYPE_INT8:
        case LY_TYPE_INT16:
        case LY_TYPE_INT32:
        case LY_TYPE_INT64:
        case LY_TYPE_UINT8:
        case LY_TYPE_UINT16:
        case LY_TYPE_UINT32:
        case LY_TYPE_UINT64:
            if (type->info.num.range) {
                break;
            }
            goto cleanup;
        case LY_TYPE_STRING:
            if (type->info.str.length || type->info.str.patterns) {
                break;
            }
            goto cleanup;
        case LY_TYPE_UNION:
            /* way too much trouble learning whether we need to check the default again, so just do it */
            break;
        default:
            LOGINT(ctx);
            ret = -1;
            goto cleanup;
        }
    } else if (type->base == LY_TYPE_EMPTY) {
        LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, "default", type->parent->name);
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "The \"empty\" data type cannot have a default value.");
        ret = -1;
        goto cleanup;
    }

    /* dummy leaf */
    memset(&node, 0, sizeof node);
    node.value_str = lydict_insert(ctx, dflt, 0);
    node.value_type = type->base;

    if (tpdf) {
        node.schema = calloc(1, sizeof (struct lys_node_leaf));
        if (!node.schema) {
            LOGMEM(ctx);
            ret = -1;
            goto cleanup;
        }
        r = asprintf((char **)&node.schema->name, "typedef-%s-default", ((struct lys_tpdf *)type->parent)->name);
        if (r == -1) {
            LOGMEM(ctx);
            ret = -1;
            goto cleanup;
        }
        node.schema->module = module;
        memcpy(&((struct lys_node_leaf *)node.schema)->type, type, sizeof *type);
    } else {
        node.schema = (struct lys_node *)type->parent;
    }

    if (type->base == LY_TYPE_LEAFREF) {
        if (!type->info.lref.target) {
            ret = EXIT_FAILURE;
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Default value \"%s\" cannot be checked in an unresolved leafref.",
                   dflt);
            goto cleanup;
        }
        ret = check_default(&type->info.lref.target->type, &dflt, module, 0);
        if (!ret) {
            /* adopt possibly changed default value to its canonical form */
            if (*value) {
                lydict_remove(ctx, *value);
                *value = dflt;
                dflt = NULL;
            }
        }
    } else {
        if (!lyp_parse_value(type, &node.value_str, NULL, &node, NULL, module, 1, 1, 0)) {
            /* possible forward reference */
            ret = EXIT_FAILURE;
            if (base_tpdf) {
                /* default value is defined in some base typedef */
                if ((type->base == LY_TYPE_BITS && type->der->type.der) ||
                        (type->base == LY_TYPE_ENUM && type->der->type.der)) {
                    /* we have refined bits/enums */
                    LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL,
                           "Invalid value \"%s\" of the default statement inherited to \"%s\" from \"%s\" base type.",
                           dflt, type->parent->name, base_tpdf->name);
                }
            }
        } else {
            /* success - adopt canonical form from the node into the default value */
            if (!ly_strequal(dflt, node.value_str, 1)) {
                /* this can happen only if we have non-inherited default value,
                 * inherited default values are already in canonical form */
                assert(ly_strequal(dflt, *value, 1));

                lydict_remove(ctx, *value);
                *value = node.value_str;
                node.value_str = NULL;
            }
        }
    }

cleanup:
    lyd_free_value(node.value, node.value_type, node.value_flags, type, node.value_str, NULL, NULL, NULL);
    lydict_remove(ctx, node.value_str);
    if (tpdf && node.schema) {
        free((char *)node.schema->name);
        free(node.schema);
    }
    lydict_remove(ctx, dflt);

    return ret;
}